

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Mutex.cpp
# Opt level: O0

bool __thiscall axl::sys::psx::MutexAttr::getType(MutexAttr *this,int *value)

{
  int iVar1;
  int *in_RSI;
  pthread_mutexattr_t *in_RDI;
  int result;
  undefined1 local_4d;
  uint_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = pthread_mutexattr_gettype(in_RDI,in_RSI);
  if (iVar1 == 0) {
    local_4d = true;
  }
  else {
    err::ErrorRef::ErrorRef
              ((ErrorRef *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    local_4d = err::fail((ErrorRef *)0x140b17);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x140b44);
  }
  return local_4d;
}

Assistant:

bool
MutexAttr::getType(int* value) const {
	int result = ::pthread_mutexattr_gettype(&m_attr, value);
	return result == 0 ? true : err::fail(result);
}